

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

void ucnv_toUnicode_63(UConverter *cnv,UChar **target,UChar *targetLimit,char **source,
                      char *sourceLimit,int32_t *offsets,UBool flush,UErrorCode *err)

{
  UChar *pUVar1;
  UBool UVar2;
  ulong uVar3;
  UChar *pUVar4;
  int32_t *offsets_local;
  char *local_70;
  UConverterToUnicodeArgs args;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((target != (UChar **)0x0 && cnv != (UConverter *)0x0) && source != (char **)0x0) {
      args.source = *source;
      pUVar4 = (UChar *)0xffffffffffffffff;
      if (targetLimit < (UChar *)0xffffffff80000001) {
        pUVar4 = (UChar *)((long)targetLimit + 0x7fffffff);
      }
      if (args.source <= sourceLimit) {
        pUVar1 = *target;
        pUVar4 = (UChar *)((long)targetLimit - (ulong)(pUVar4 == targetLimit));
        if (((pUVar1 <= pUVar4) &&
            (sourceLimit <= args.source ||
             (ulong)((long)sourceLimit - (long)args.source) < 0x80000000)) &&
           (uVar3 = (long)pUVar4 - (long)pUVar1,
           (uVar3 < 0x7fffffff || (pUVar4 < pUVar1 || uVar3 == 0)) && (uVar3 & 1) == 0)) {
          offsets_local = offsets;
          if (('\0' < cnv->UCharErrorBufferLength) &&
             (local_70 = args.source,
             UVar2 = ucnv_outputOverflowToUnicode(cnv,target,pUVar4,&offsets_local,err),
             args.source = local_70, UVar2 != '\0')) {
            return;
          }
          if ((args.source == sourceLimit && flush == '\0') && (-1 < cnv->preToULength)) {
            return;
          }
          args.flush = flush;
          args.offsets = offsets_local;
          args.target = *target;
          args.size = 0x38;
          args.converter = cnv;
          args.sourceLimit = sourceLimit;
          args.targetLimit = pUVar4;
          _toUnicodeWithCallback(&args,err);
          *source = args.source;
          *target = args.target;
          return;
        }
      }
    }
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ucnv_toUnicode(UConverter *cnv,
               UChar **target, const UChar *targetLimit,
               const char **source, const char *sourceLimit,
               int32_t *offsets,
               UBool flush,
               UErrorCode *err) {
    UConverterToUnicodeArgs args;
    const char *s;
    UChar *t;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return;
    }

    if(cnv==NULL || target==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    s=*source;
    t=*target;

    if ((const void *)U_MAX_PTR(targetLimit) == (const void *)targetLimit) {
        /*
        Prevent code from going into an infinite loop in case we do hit this
        limit. The limit pointer is expected to be on a UChar * boundary.
        This also prevents the next argument check from failing.
        */
        targetLimit = (const UChar *)(((const char *)targetLimit) - 1);
    }

    /*
     * All these conditions should never happen.
     *
     * 1) Make sure that the limits are >= to the address source or target
     *
     * 2) Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be sourceLimit=t+0x7fffffff; for example.
     *
     * 3) Make sure that the user didn't incorrectly cast a UChar * pointer
     * to a char * pointer and provide an incomplete UChar code unit.
     */
    if (sourceLimit<s || targetLimit<t ||
        ((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s) ||
        ((size_t)(targetLimit-t)>(size_t)0x3fffffff && targetLimit>t) ||
        (((const char *)targetLimit-(const char *)t) & 1) != 0
    ) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    
    /* output the target overflow buffer */
    if( cnv->UCharErrorBufferLength>0 &&
        ucnv_outputOverflowToUnicode(cnv, target, targetLimit, &offsets, err)
    ) {
        /* U_BUFFER_OVERFLOW_ERROR */
        return;
    }
    /* *target may have moved, therefore stop using t */

    if(!flush && s==sourceLimit && cnv->preToULength>=0) {
        /* the overflow buffer is emptied and there is no new input: we are done */
        return;
    }

    /*
     * Do not simply return with a buffer overflow error if
     * !flush && t==targetLimit
     * because it is possible that the source will not generate any output.
     * For example, the skip callback may be called;
     * it does not output anything.
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=flush;
    args.offsets=offsets;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=*target;
    args.targetLimit=targetLimit;
    args.size=sizeof(args);

    _toUnicodeWithCallback(&args, err);

    *source=args.source;
    *target=args.target;
}